

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<std::function<void_()>,_0UL>::reserve
          (SmallVector<std::function<void_()>,_0UL> *this,size_t count)

{
  undefined8 *puVar1;
  function<void_()> *pfVar2;
  code *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  function<void_()> *pfVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  
  if (count >> 0x3b == 0) {
    uVar11 = this->buffer_capacity;
    if (uVar11 < count) {
      uVar11 = uVar11 + (uVar11 == 0);
      do {
        uVar5 = uVar11;
        uVar11 = uVar5 * 2;
      } while (uVar5 < count);
      if (uVar5 == 0) {
        pfVar6 = (function<void_()> *)0x0;
      }
      else {
        pfVar6 = (function<void_()> *)malloc(uVar5 << 5);
      }
      if (pfVar6 == (function<void_()> *)0x0) goto LAB_0019228c;
      if ((pfVar6 != (this->super_VectorView<std::function<void_()>_>).ptr) &&
         ((this->super_VectorView<std::function<void_()>_>).buffer_size != 0)) {
        lVar10 = 0;
        uVar11 = 0;
        do {
          pfVar2 = (this->super_VectorView<std::function<void_()>_>).ptr;
          puVar1 = (undefined8 *)((long)&(pfVar6->super__Function_base)._M_functor + lVar10);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined8 *)((long)&(pfVar6->super__Function_base)._M_manager + lVar10) = 0;
          *(undefined8 *)((long)&pfVar6->_M_invoker + lVar10) =
               *(undefined8 *)((long)&pfVar2->_M_invoker + lVar10);
          if (*(long *)((long)&(pfVar2->super__Function_base)._M_manager + lVar10) != 0) {
            puVar1 = (undefined8 *)((long)&(pfVar6->super__Function_base)._M_functor + lVar10);
            puVar8 = (undefined8 *)((long)&(pfVar2->super__Function_base)._M_manager + lVar10);
            puVar7 = (undefined8 *)((long)&(pfVar2->super__Function_base)._M_functor + lVar10);
            uVar4 = puVar7[1];
            *puVar1 = *puVar7;
            puVar1[1] = uVar4;
            *(undefined8 *)((long)&(pfVar6->super__Function_base)._M_manager + lVar10) = *puVar8;
            *puVar8 = 0;
            *(undefined8 *)((long)&pfVar2->_M_invoker + lVar10) = 0;
          }
          pfVar2 = (this->super_VectorView<std::function<void_()>_>).ptr;
          pcVar3 = *(code **)((long)&(pfVar2->super__Function_base)._M_manager + lVar10);
          if (pcVar3 != (code *)0x0) {
            lVar9 = (long)&(pfVar2->super__Function_base)._M_functor + lVar10;
            (*pcVar3)(lVar9,lVar9,3);
          }
          uVar11 = uVar11 + 1;
          lVar10 = lVar10 + 0x20;
        } while (uVar11 < (this->super_VectorView<std::function<void_()>_>).buffer_size);
      }
      pfVar2 = (this->super_VectorView<std::function<void_()>_>).ptr;
      if (pfVar2 != (function<void_()> *)0x0) {
        free(pfVar2);
      }
      (this->super_VectorView<std::function<void_()>_>).ptr = pfVar6;
      this->buffer_capacity = uVar5;
    }
    return;
  }
LAB_0019228c:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}